

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.h
# Opt level: O3

bool __thiscall Assimp::ColladaMeshIndex::operator<(ColladaMeshIndex *this,ColladaMeshIndex *p)

{
  size_t __n;
  int iVar1;
  byte extraout_var;
  byte bVar2;
  byte extraout_var_00;
  
  __n = (this->mMeshID)._M_string_length;
  if ((__n == (p->mMeshID)._M_string_length) &&
     ((__n == 0 ||
      (iVar1 = bcmp((this->mMeshID)._M_dataplus._M_p,(p->mMeshID)._M_dataplus._M_p,__n), iVar1 == 0)
      ))) {
    if (this->mSubMesh != p->mSubMesh) {
      return this->mSubMesh < p->mSubMesh;
    }
    std::__cxx11::string::compare((string *)&this->mMaterial);
    bVar2 = extraout_var_00;
  }
  else {
    std::__cxx11::string::compare((string *)this);
    bVar2 = extraout_var;
  }
  return (bool)(bVar2 >> 7);
}

Assistant:

bool operator < (const ColladaMeshIndex& p) const
    {
        if( mMeshID == p.mMeshID)
        {
            if( mSubMesh == p.mSubMesh)
                return mMaterial < p.mMaterial;
            else
                return mSubMesh < p.mSubMesh;
        } else
        {
            return mMeshID < p.mMeshID;
        }
    }